

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void VP8LOptimizeSampling
               (uint32_t *image,int full_width,int full_height,int bits,int max_bits,
               int *best_bits_out)

{
  char cVar1;
  bool bVar2;
  uint32_t b;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  uint32_t in_ECX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  int in_R8D;
  uint32_t *in_R9;
  int i;
  int is_good_1;
  int is_good;
  int new_square_size;
  int best_bits;
  int square_size;
  int y;
  int x;
  int old_width;
  int height;
  int width;
  int local_4c;
  uint32_t local_3c;
  int local_34;
  int local_30;
  
  b = VP8LSubSampleSize(in_ESI,in_ECX);
  uVar3 = VP8LSubSampleSize(in_EDX,in_ECX);
  *in_R9 = in_ECX;
  for (local_3c = in_ECX; cVar1 = (char)in_ECX, (int)local_3c < in_R8D; local_3c = local_3c + 1) {
    bVar2 = true;
    iVar4 = 1 << ((char)local_3c - cVar1 & 0x1fU);
    for (local_34 = 0; local_34 + iVar4 < (int)uVar3;
        local_34 = (1 << (((char)local_3c + '\x01') - cVar1 & 0x1fU)) + local_34) {
      iVar5 = memcmp((void *)(in_RDI + (long)(int)(local_34 * b) * 4),
                     (void *)(in_RDI + (long)(int)((local_34 + iVar4) * b) * 4),(long)(int)b << 2);
      if (iVar5 != 0) {
        bVar2 = false;
        break;
      }
    }
    if (!bVar2) break;
  }
  if (local_3c != in_ECX) {
    for (; (int)in_ECX < (int)local_3c; local_3c = local_3c - 1) {
      bVar2 = true;
      iVar4 = 1 << ((char)local_3c - cVar1 & 0x1fU);
      for (local_34 = 0; bVar2 && local_34 < (int)uVar3; local_34 = local_34 + 1) {
        for (local_30 = 0; local_4c = local_30, bVar2 && local_30 < (int)b;
            local_30 = iVar4 + local_30) {
          do {
            local_4c = local_4c + 1;
            iVar5 = GetMin(local_30 + iVar4,b);
            if (iVar5 <= local_4c) goto LAB_0019e4c8;
          } while (*(int *)(in_RDI + (long)(int)(local_34 * b + local_4c) * 4) ==
                   *(int *)(in_RDI + (long)(int)(local_34 * b + local_30) * 4));
          bVar2 = false;
LAB_0019e4c8:
        }
      }
      if (bVar2) break;
    }
    if (local_3c != in_ECX) {
      uVar3 = VP8LSubSampleSize(in_ESI,local_3c);
      uVar6 = VP8LSubSampleSize(in_EDX,local_3c);
      for (local_34 = 0; local_34 < (int)uVar6; local_34 = local_34 + 1) {
        for (local_30 = 0; local_30 < (int)uVar3; local_30 = local_30 + 1) {
          *(undefined4 *)(in_RDI + (long)(int)(local_34 * uVar3 + local_30) * 4) =
               *(undefined4 *)
                (in_RDI + (long)(int)((1 << ((char)local_3c - cVar1 & 0x1fU)) *
                                     (local_34 * b + local_30)) * 4);
        }
      }
      *in_R9 = local_3c;
    }
  }
  return;
}

Assistant:

void VP8LOptimizeSampling(uint32_t* const image, int full_width,
                          int full_height, int bits, int max_bits,
                          int* best_bits_out) {
  int width = VP8LSubSampleSize(full_width, bits);
  int height = VP8LSubSampleSize(full_height, bits);
  int old_width, x, y, square_size;
  int best_bits = bits;
  *best_bits_out = bits;
  // Check rows first.
  while (best_bits < max_bits) {
    const int new_square_size = 1 << (best_bits + 1 - bits);
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; y + square_size < height; y += new_square_size) {
      // Check the first lines of consecutive line groups.
      if (memcmp(&image[y * width], &image[(y + square_size) * width],
                 width * sizeof(*image)) != 0) {
        is_good = 0;
        break;
      }
    }
    if (is_good) {
      ++best_bits;
    } else {
      break;
    }
  }
  if (best_bits == bits) return;

  // Check columns.
  while (best_bits > bits) {
    int is_good = 1;
    square_size = 1 << (best_bits - bits);
    for (y = 0; is_good && y < height; ++y) {
      for (x = 0; is_good && x < width; x += square_size) {
        int i;
        for (i = x + 1; i < GetMin(x + square_size, width); ++i) {
          if (image[y * width + i] != image[y * width + x]) {
            is_good = 0;
            break;
          }
        }
      }
    }
    if (is_good) {
      break;
    }
    --best_bits;
  }
  if (best_bits == bits) return;

  // Subsample the image.
  old_width = width;
  square_size = 1 << (best_bits - bits);
  width = VP8LSubSampleSize(full_width, best_bits);
  height = VP8LSubSampleSize(full_height, best_bits);
  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      image[y * width + x] = image[square_size * (y * old_width + x)];
    }
  }
  *best_bits_out = best_bits;
}